

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

void __thiscall libtorrent::dht::rpc_manager::add_our_id(rpc_manager *this,entry *e)

{
  entry *this_00;
  string_view key;
  string sStack_28;
  
  digest32<160l>::to_string_abi_cxx11_(&sStack_28,&this->m_our_id);
  key._M_str = "id";
  key._M_len = 2;
  this_00 = entry::operator[](e,key);
  entry::operator=(this_00,&sStack_28);
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void rpc_manager::add_our_id(entry& e)
{
	e["id"] = m_our_id.to_string();
}